

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O0

void __thiscall
TTD::TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
          (TTDCompareMap *this,TTD_PTR_ID h1PtrId,TTD_PTR_ID h2PtrId)

{
  bool bVar1;
  unsigned_long uVar2;
  bool local_29;
  TTD_PTR_ID local_20;
  TTD_PTR_ID h2PtrId_local;
  TTD_PTR_ID h1PtrId_local;
  TTDCompareMap *this_local;
  
  local_20 = h2PtrId;
  h2PtrId_local = h1PtrId;
  h1PtrId_local = (TTD_PTR_ID)this;
  if ((h1PtrId == 0) || (h2PtrId == 0)) {
    local_29 = h1PtrId == 0 && h2PtrId == 0;
    DiagnosticAssert(this,local_29);
  }
  else {
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(&this->H1PtrToH2PtrMap,&h2PtrId_local);
    if (bVar1) {
      uVar2 = JsUtil::
              BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Item(&this->H1PtrToH2PtrMap,&h2PtrId_local);
      DiagnosticAssert(this,uVar2 == local_20);
    }
    else {
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew(&this->H1PtrToH2PtrMap,&h2PtrId_local,&local_20);
    }
  }
  return;
}

Assistant:

void TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue(TTD_PTR_ID h1PtrId, TTD_PTR_ID h2PtrId)
    {
        if(h1PtrId == TTD_INVALID_PTR_ID || h2PtrId == TTD_INVALID_PTR_ID)
        {
            this->DiagnosticAssert(h1PtrId == TTD_INVALID_PTR_ID && h2PtrId == TTD_INVALID_PTR_ID);
        }
        else if(this->H1PtrToH2PtrMap.ContainsKey(h1PtrId))
        {
            this->DiagnosticAssert(this->H1PtrToH2PtrMap.Item(h1PtrId) == h2PtrId);
        }
        else
        {
            this->H1PtrToH2PtrMap.AddNew(h1PtrId, h2PtrId);
        }
    }